

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

void __thiscall create::Packet::setDataToValidate(Packet *this,uint16_t *tmp)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  uint16_t *tmp_local;
  Packet *this_local;
  
  lock._M_device = (mutex_type *)tmp;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->tmpDataMutex);
  this->tmpData = *(uint16_t *)&((lock._M_device)->super___mutex_base)._M_mutex;
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void Packet::setDataToValidate(const uint16_t& tmp) {
    std::lock_guard<std::mutex> lock(tmpDataMutex);
    tmpData = tmp;
  }